

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O2

int __thiscall Fl_Browser_::handle(Fl_Browser_ *this,int event)

{
  uint *puVar1;
  uchar uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *pvVar8;
  void *pvVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  void *pvVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  int iVar11;
  fd_set *in_R8;
  fd_set *__exceptfds;
  timeval *in_R9;
  Fl_Widget_Tracker wp;
  int H;
  int Y;
  int W;
  int X;
  
  Fl_Widget_Tracker::Fl_Widget_Tracker(&wp,(Fl_Widget *)this);
  iVar7 = 1;
  if (event - 3U < 2) goto switchD_001a7d65_caseD_3;
  if ((event == 8) && (bVar3 = (this->super_Fl_Group).super_Fl_Widget.type_, 1 < bVar3)) {
    pvVar8 = this->selection_;
    pvVar10 = pvVar8;
    if (pvVar8 == (void *)0x0) {
      pvVar10 = this->top_;
    }
    if (pvVar10 == (void *)0x0) {
      iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      pvVar10 = (void *)CONCAT44(extraout_var,iVar4);
      if (pvVar10 == (void *)0x0) goto LAB_001a7d0e;
      bVar3 = (this->super_Fl_Group).super_Fl_Widget.type_;
    }
    if (bVar3 != 2) {
      if (Fl::e_keysym == 0x20) {
        this->selection_ = pvVar10;
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar10);
        select(this,(int)pvVar10,(fd_set *)(ulong)(iVar4 == 0),
               (fd_set *)(ulong)((this->super_Fl_Group).super_Fl_Widget.when_ & 0xfffffff7),in_R8,
               in_R9);
        goto switchD_001a7d65_caseD_3;
      }
      if ((Fl::e_keysym == 0xff0d) || (Fl::e_keysym == 0xff8d)) {
        select_only(this,pvVar10,(this->super_Fl_Group).super_Fl_Widget.when_ & 0xfffffff7);
        if ((wp.wp_ != (Fl_Widget *)0x0) &&
           (((this->super_Fl_Group).super_Fl_Widget.when_ & 8) != 0)) {
          puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
          *(byte *)puVar1 = (byte)*puVar1 | 0x80;
          Fl_Widget::do_callback((Fl_Widget *)this);
        }
        goto switchD_001a7d65_caseD_3;
      }
      if (Fl::e_keysym == 0xff54) {
        do {
          iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar10);
          pvVar10 = (void *)CONCAT44(extraout_var_04,iVar4);
          if (pvVar10 == (void *)0x0) goto LAB_001a80a2;
          if ((Fl::e_state & 0x50000U) != 0) {
            uVar5 = 1;
            if (pvVar8 != (void *)0x0) {
              uVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar8);
            }
            select(this,iVar4,(fd_set *)(ulong)uVar5,
                   (fd_set *)(ulong)(this->super_Fl_Group).super_Fl_Widget.when_,in_R8,in_R9);
          }
          if (wp.wp_ == (Fl_Widget *)0x0) goto LAB_001a80a2;
          iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar10);
        } while (iVar4 < 1);
      }
      else {
        if (Fl::e_keysym != 0xff52) goto LAB_001a7d0e;
        do {
          iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar10);
          pvVar10 = (void *)CONCAT44(extraout_var_02,iVar4);
          if (pvVar10 == (void *)0x0) goto LAB_001a80a2;
          if ((Fl::e_state & 0x50000U) != 0) {
            uVar5 = 1;
            if (pvVar8 != (void *)0x0) {
              uVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar8);
            }
            select(this,iVar4,(fd_set *)(ulong)uVar5,
                   (fd_set *)(ulong)(this->super_Fl_Group).super_Fl_Widget.when_,in_R8,in_R9);
          }
          if (wp.wp_ == (Fl_Widget *)0x0) goto LAB_001a80a2;
          iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar10);
        } while (iVar4 < 1);
      }
      if (this->selection_ != (void *)0x0) {
        redraw_line(this,this->selection_);
      }
      this->selection_ = pvVar10;
      redraw_line(this,pvVar10);
      display(this,pvVar10);
      goto switchD_001a7d65_caseD_3;
    }
    if (Fl::e_keysym == 0xff54) {
      do {
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar10);
        pvVar10 = (void *)CONCAT44(extraout_var_01,iVar4);
        if (pvVar10 == (void *)0x0) goto switchD_001a7d65_caseD_3;
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar10);
      } while (iVar4 < 1);
    }
    else {
      if (Fl::e_keysym != 0xff52) goto LAB_001a7d0e;
      do {
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar10);
        pvVar10 = (void *)CONCAT44(extraout_var_00,iVar4);
        if (pvVar10 == (void *)0x0) goto switchD_001a7d65_caseD_3;
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar10);
      } while (iVar4 < 1);
    }
    select_only(this,pvVar10,(uint)(this->super_Fl_Group).super_Fl_Widget.when_);
    goto switchD_001a7d65_caseD_3;
  }
LAB_001a7d0e:
  iVar4 = Fl_Group::handle(&this->super_Fl_Group,event);
  if ((iVar4 != 0) || (wp.wp_ == (Fl_Widget *)0x0)) goto switchD_001a7d65_caseD_3;
  __exceptfds = (fd_set *)&H;
  bbox(this,&X,&Y,&W,(int *)__exceptfds);
  iVar4 = Fl::e_y;
  iVar7 = 0;
  switch(event) {
  case 1:
    iVar4 = Fl::event_inside(X,Y,W,H);
    if (iVar4 == 0) goto switchD_001a7d65_caseD_3;
    iVar7 = Fl::visible_focus();
    if (iVar7 != 0) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    handle::py = Fl::e_y;
    handle::change = '\0';
    uVar2 = (this->super_Fl_Group).super_Fl_Widget.type_;
    iVar7 = 1;
    if ((uVar2 == '\0') || (this->top_ == (void *)0x0)) goto switchD_001a7d65_caseD_3;
    if (uVar2 != '\x03') {
      pvVar8 = find_item(this,Fl::e_y);
      iVar4 = select_only(this,pvVar8,0);
      handle::change = (char)iVar4;
      if ((handle::change == '\0') || (wp.wp_ == (Fl_Widget *)0x0)) goto switchD_001a7d65_caseD_3;
      bVar3 = (this->super_Fl_Group).super_Fl_Widget.when_ & 1;
      goto joined_r0x001a7ff0;
    }
    pvVar8 = find_item(this,Fl::e_y);
    handle::whichway = '\x01';
    if (((uint)Fl::e_state >> 0x12 & 1) == 0) {
      if (((uint)Fl::e_state >> 0x10 & 1) != 0) {
        pvVar10 = this->selection_;
        if (pvVar8 != pvVar10) {
          if (pvVar8 != (void *)0x0) {
            iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar8);
            handle::whichway = iVar4 == 0;
            pvVar10 = this->selection_;
            while (pvVar10 != pvVar8) {
              if (pvVar10 == (void *)0x0) {
                pvVar10 = this->selection_;
                iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar8);
                pvVar9 = (void *)CONCAT44(extraout_var_09,iVar4);
                goto LAB_001a8328;
              }
              iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar10);
              pvVar10 = (void *)CONCAT44(extraout_var_07,iVar4);
            }
            pvVar10 = this->selection_;
          }
          while (pvVar10 != pvVar8) {
            select(this,(int)pvVar10,(fd_set *)(ulong)(byte)handle::whichway,
                   (fd_set *)(ulong)((this->super_Fl_Group).super_Fl_Widget.when_ & 1),__exceptfds,
                   in_R9);
            if (wp.wp_ == (Fl_Widget *)0x0) goto switchD_001a7d65_caseD_3;
            iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar10);
            pvVar10 = (void *)CONCAT44(extraout_var_08,iVar4);
          }
LAB_001a8367:
          handle::change = '\x01';
          if (pvVar8 != (void *)0x0) {
            select(this,(int)pvVar8,(fd_set *)(ulong)(byte)handle::whichway,
                   (fd_set *)(ulong)((this->super_Fl_Group).super_Fl_Widget.when_ & 1),__exceptfds,
                   in_R9);
          }
          goto switchD_001a7d65_caseD_3;
        }
        goto LAB_001a8266;
      }
      iVar4 = select_only(this,pvVar8,0);
      handle::change = (char)iVar4;
      if (handle::change == '\0') goto switchD_001a7d65_caseD_3;
    }
    else {
LAB_001a8266:
      if (pvVar8 == (void *)0x0) goto switchD_001a7d65_caseD_3;
      iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar8);
      handle::whichway = iVar4 == 0;
      iVar4 = select(this,(int)pvVar8,(fd_set *)(ulong)(byte)handle::whichway,(fd_set *)0x0,
                     __exceptfds,in_R9);
      handle::change = (char)iVar4;
      if (iVar4 == 0) goto switchD_001a7d65_caseD_3;
    }
    if ((wp.wp_ != (Fl_Widget *)0x0) && (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
      puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
    goto switchD_001a7d65_caseD_3;
  case 2:
    if ((this->super_Fl_Group).super_Fl_Widget.type_ == '\x01') {
      pvVar8 = this->selection_;
      deselect(this,0);
      if (wp.wp_ == (Fl_Widget *)0x0) break;
      this->selection_ = pvVar8;
    }
    if (handle::change == '\0') {
      bVar3 = (this->super_Fl_Group).super_Fl_Widget.when_ & 2;
    }
    else {
      puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      bVar3 = (this->super_Fl_Group).super_Fl_Widget.when_ & 4;
    }
    if (bVar3 != 0) {
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
    iVar7 = 1;
    if ((wp.wp_ == (Fl_Widget *)0x0) || (Fl::e_clicks == 0)) goto switchD_001a7d65_caseD_3;
    bVar3 = (this->super_Fl_Group).super_Fl_Widget.when_ & 8;
joined_r0x001a7ff0:
    iVar7 = 1;
    if (bVar3 == 0) goto switchD_001a7d65_caseD_3;
    puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    Fl_Widget::do_callback((Fl_Widget *)this);
    break;
  default:
    goto switchD_001a7d65_caseD_3;
  case 5:
    if (Fl::e_y < handle::py && Fl::e_y < Y) {
      iVar11 = (Fl::e_y - Y) + this->real_position_;
      iVar7 = 0;
      if (0 < iVar11) {
        iVar7 = iVar11;
      }
      position(this,iVar7);
    }
    else {
      iVar7 = Fl::e_y - (Y + H);
      if (handle::py < Fl::e_y && (iVar7 != 0 && Y + H <= Fl::e_y)) {
        iVar11 = this->real_position_;
        iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
        iVar7 = iVar7 + iVar11;
        iVar11 = iVar6 - H;
        if (iVar7 < iVar6 - H) {
          iVar11 = iVar7;
        }
        iVar7 = 0;
        if (0 < iVar11) {
          iVar7 = iVar11;
        }
        position(this,iVar7);
      }
    }
    uVar2 = (this->super_Fl_Group).super_Fl_Widget.type_;
    if ((uVar2 != '\0') && (this->top_ != (void *)0x0)) {
      if (uVar2 == '\x03') {
        pvVar9 = find_item(this,iVar4);
        pvVar8 = this->selection_;
        pvVar10 = pvVar9;
        if (handle::py < iVar4) {
          if (pvVar8 == (void *)0x0) {
            pvVar10 = (void *)0x0;
          }
          else {
            iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar8);
            pvVar10 = (void *)CONCAT44(extraout_var_03,iVar7);
          }
          if (pvVar9 == (void *)0x0) {
            pvVar8 = (void *)0x0;
          }
          else {
            iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar9);
            pvVar8 = (void *)CONCAT44(extraout_var_05,iVar7);
          }
        }
        iVar7 = 1;
        while ((pvVar10 != (void *)0x0 && (pvVar10 != pvVar8))) {
          iVar11 = select(this,(int)pvVar10,(fd_set *)(ulong)(byte)handle::whichway,(fd_set *)0x0,
                          __exceptfds,in_R9);
          if (wp.wp_ == (Fl_Widget *)0x0) goto switchD_001a7d65_caseD_3;
          handle::change = handle::change | (byte)iVar11;
          if ((iVar11 != 0) && (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
            puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
            *(byte *)puVar1 = (byte)*puVar1 | 0x80;
            Fl_Widget::do_callback((Fl_Widget *)this);
            if (wp.wp_ == (Fl_Widget *)0x0) goto switchD_001a7d65_caseD_3;
          }
          iVar11 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar10);
          pvVar10 = (void *)CONCAT44(extraout_var_06,iVar11);
        }
        if (pvVar9 != (void *)0x0) {
          this->selection_ = pvVar9;
        }
      }
      else {
        pvVar8 = this->selection_;
        iVar7 = (this->super_Fl_Group).super_Fl_Widget.x_;
        pvVar10 = pvVar8;
        if ((iVar7 <= Fl::e_x) && (Fl::e_x <= iVar7 + (this->super_Fl_Group).super_Fl_Widget.w_)) {
          pvVar10 = find_item(this,iVar4);
        }
        handle::change = pvVar10 != pvVar8;
        select_only(this,pvVar10,(this->super_Fl_Group).super_Fl_Widget.when_ & 1);
        if (wp.wp_ == (Fl_Widget *)0x0) break;
      }
    }
    handle::py = iVar4;
    break;
  case 6:
  case 7:
    if (((this->super_Fl_Group).super_Fl_Widget.type_ < 2) ||
       (iVar4 = Fl::visible_focus(), iVar4 == 0)) goto switchD_001a7d65_caseD_3;
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  iVar7 = 1;
switchD_001a7d65_caseD_3:
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&wp);
  return iVar7;
LAB_001a80a2:
  iVar7 = 1;
  goto switchD_001a7d65_caseD_3;
LAB_001a8328:
  if (pvVar9 == (void *)0x0) goto LAB_001a8367;
  select(this,(int)pvVar9,(fd_set *)(ulong)(byte)handle::whichway,
         (fd_set *)(ulong)((this->super_Fl_Group).super_Fl_Widget.when_ & 1),__exceptfds,in_R9);
  if (wp.wp_ == (Fl_Widget *)0x0) goto switchD_001a7d65_caseD_3;
  if (pvVar9 == pvVar10) goto LAB_001a8367;
  iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar9);
  pvVar9 = (void *)CONCAT44(extraout_var_10,iVar4);
  goto LAB_001a8328;
}

Assistant:

int Fl_Browser_::handle(int event) {

  // NOTE:
  // We use Fl_Widget_Tracker to test if the user has deleted
  // this widget in a callback. Callbacks can be called by:
  //  - do_callback()
  //  - select()
  //  - select_only()
  //  - deselect()
  // Thus we must test wp.deleted() after each of these calls,
  // unless we return directly after one of these.
  // If wp.deleted() is true, we return 1 because we used the event.

  Fl_Widget_Tracker wp(this);

  // must do shortcuts first or the scrollbar will get them...
  if (event == FL_ENTER || event == FL_LEAVE) return 1;
  if (event == FL_KEYBOARD && type() >= FL_HOLD_BROWSER) {
    void* l1 = selection_;
    void* l = l1; if (!l) l = top_; if (!l) l = item_first();
    if (l) {
      if (type()==FL_HOLD_BROWSER) {
        switch (Fl::event_key()) {
        case FL_Down:
	  while ((l = item_next(l))) {
	    if (item_height(l)>0) {select_only(l, when()); break;}
	  }
	  return 1;
        case FL_Up:
          while ((l = item_prev(l))) {
	    if (item_height(l)>0) {
	      select_only(l, when());
	      break; // no need to test wp (return 1)
	    }
	  }
          return 1;
        } 
      } else  {
        switch (Fl::event_key()) {
        case FL_Enter:
        case FL_KP_Enter:
          select_only(l, when() & ~FL_WHEN_ENTER_KEY);
	  if (wp.deleted()) return 1;
	  if (when() & FL_WHEN_ENTER_KEY) {
	    set_changed();
	    do_callback();
	  }
          return 1;
        case ' ':
          selection_ = l;
          select(l, !item_selected(l), when() & ~FL_WHEN_ENTER_KEY);
          return 1;
        case FL_Down:
          while ((l = item_next(l))) {
            if (Fl::event_state(FL_SHIFT|FL_CTRL))
              select(l, l1 ? item_selected(l1) : 1, when());
	    if (wp.deleted()) return 1;
            if (item_height(l)>0) goto J1;
          }
          return 1;
        case FL_Up:
          while ((l = item_prev(l))) {
            if (Fl::event_state(FL_SHIFT|FL_CTRL))
              select(l, l1 ? item_selected(l1) : 1, when());
	    if (wp.deleted()) return 1;
            if (item_height(l)>0) goto J1;
          }
          return 1;
J1:
          if (selection_) redraw_line(selection_);
          selection_ = l; redraw_line(l);
          display(l);
          return 1;
        }
      }
    }
  }
  
  if (Fl_Group::handle(event)) return 1;
  if (wp.deleted()) return 1;

  int X, Y, W, H; bbox(X, Y, W, H);
  int my;
// NOTE:
// instead of:
//     change = select_only(find_item(my), when() & FL_WHEN_CHANGED)
// we use the construct:
//     change = select_only(find_item(my), 0);
//     if (change && (when() & FL_WHEN_CHANGED)) {
//	 set_changed();
//       do_callback();
//     }
// See str #834
// The first form calls the callback *before* setting change.
// The callback may execute an Fl::wait(), resulting in another
// call of Fl_Browser_::handle() for the same widget. The sequence
// of events can be an FL_PUSH followed by an FL_RELEASE.
// This second call of Fl_Browser_::handle() may result in a -
// somewhat unexpected - second concurrent invocation of the callback.

  static char change;
  static char whichway;
  static int py;
  switch (event) {
  case FL_PUSH:
    if (!Fl::event_inside(X, Y, W, H)) return 0;
    if (Fl::visible_focus()) {
      Fl::focus(this);
      redraw();
    }
    my = py = Fl::event_y();
    change = 0;
    if (type() == FL_NORMAL_BROWSER || !top_)
      ;
    else if (type() != FL_MULTI_BROWSER) {
      change = select_only(find_item(my), 0);
      if (wp.deleted()) return 1;
      if (change && (when() & FL_WHEN_CHANGED)) {
	set_changed();
	do_callback();
	if (wp.deleted()) return 1;
      }
    } else {
      void* l = find_item(my);
      whichway = 1;
      if (Fl::event_state(FL_COMMAND)) { // toggle selection:
      TOGGLE:
	if (l) {
	  whichway = !item_selected(l);
	  change = select(l, whichway, 0);
	  if (wp.deleted()) return 1;
	  if (change && (when() & FL_WHEN_CHANGED)) {
	    set_changed();
	    do_callback();
	    if (wp.deleted()) return 1;
	  }
	}
      } else if (Fl::event_state(FL_SHIFT)) { // extend selection:
	if (l == selection_) goto TOGGLE;
	// state of previous selection determines new value:
	whichway = l ? !item_selected(l) : 1;
	// see which of the new item or previous selection is earlier,
	// by searching from the previous forward for this one:
	int down;
	if (!l) down = 1;
	else {for (void* m = selection_; ; m = item_next(m)) {
	  if (m == l) {down = 1; break;}
	  if (!m) {down = 0; break;}
	}}
	if (down) {
	  for (void* m = selection_; m != l; m = item_next(m)) {
	    select(m, whichway, when() & FL_WHEN_CHANGED);
	    if (wp.deleted()) return 1;
	  }
	} else {
	  void* e = selection_;
	  for (void* m = item_next(l); m; m = item_next(m)) {
	    select(m, whichway, when() & FL_WHEN_CHANGED);
	    if (wp.deleted()) return 1;
	    if (m == e) break;
	  }
	}
	// do the clicked item last so the select box is around it:
	change = 1;
	if (l) select(l, whichway, when() & FL_WHEN_CHANGED);
	if (wp.deleted()) return 1;
      } else { // select only this item
	change = select_only(l, 0);
	if (wp.deleted()) return 1;
	if (change && (when() & FL_WHEN_CHANGED)) {
	  set_changed();
	  do_callback();
	  if (wp.deleted()) return 1;
	}
      }
    }
    return 1;
  case FL_DRAG:
    // do the scrolling first:
    my = Fl::event_y();
    if (my < Y && my < py) {
      int p = real_position_+my-Y;
      if (p<0) p = 0;
      position(p);
    } else if (my > (Y+H) && my > py) {
      int p = real_position_+my-(Y+H);
      int hh = full_height()-H; if (p > hh) p = hh;
      if (p<0) p = 0;
      position(p);
    }
    if (type() == FL_NORMAL_BROWSER || !top_)
      ;
    else if (type() == FL_MULTI_BROWSER) {
      void* l = find_item(my);
      void* t; void* b; // this will be the range to change
      if (my > py) { // go down
	t = selection_ ? item_next(selection_) : 0;
	b = l ? item_next(l) : 0;
      } else {	// go up
	t = l;
	b = selection_;
      }
      for (; t && t != b; t = item_next(t)) {
	char change_t;
	change_t = select(t, whichway, 0);
	if (wp.deleted()) return 1;
	change |= change_t;
	if (change_t && (when() & FL_WHEN_CHANGED)) {
	  set_changed();
	  do_callback();
	  if (wp.deleted()) return 1;
	}
      }
      if (l) selection_ = l;
    } else {
      void* l1 = selection_;
      void* l =
	(Fl::event_x()<x() || Fl::event_x()>x()+w()) ? selection_ :
	find_item(my);
      change = (l != l1);
      select_only(l, when() & FL_WHEN_CHANGED);
      if (wp.deleted()) return 1;
    }
    py = my;
    return 1;
  case FL_RELEASE:
    if (type() == FL_SELECT_BROWSER) {
      void* t = selection_;
      deselect();
      if (wp.deleted()) return 1;
      selection_ = t;
    }
    if (change) {
      set_changed();
      if (when() & FL_WHEN_RELEASE) do_callback();
    } else {
      if (when() & FL_WHEN_NOT_CHANGED) do_callback();
    }
    if (wp.deleted()) return 1;

    // double click calls the callback: (like Enter Key)
    if (Fl::event_clicks() && (when() & FL_WHEN_ENTER_KEY)) {
      set_changed();
      do_callback();
    }
    return 1;
  case FL_FOCUS:
  case FL_UNFOCUS:
    if (type() >= FL_HOLD_BROWSER && Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  }

  return 0;
}